

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

double ChickenHook::log(double __x)

{
  code *pcVar1;
  char in_AL;
  int iVar2;
  char *in_RDI;
  string res;
  va_list argptr;
  string local_118;
  string local_f8 [32];
  __va_list_tag local_d8;
  undefined1 local_b8 [48];
  double local_88;
  
  if (in_AL != '\0') {
    local_88 = __x;
  }
  if ((in_RDI != (char *)0x0) && (logFunction_abi_cxx11_ != (code *)0x0)) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &res._M_string_length;
    local_d8.gp_offset = 8;
    local_d8.fp_offset = 0x30;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    iVar2 = vaListToString(in_RDI,&local_d8,&local_118);
    pcVar1 = logFunction_abi_cxx11_;
    if (0 < iVar2) {
      std::__cxx11::string::string(local_f8,(string *)&local_118);
      (*pcVar1)(local_f8);
      std::__cxx11::string::~string(local_f8);
    }
    __x = (double)std::__cxx11::string::~string((string *)&local_118);
  }
  return __x;
}

Assistant:

void log(const char *CFormatString, ...) {

        if (CFormatString == nullptr) {
            return;
        }

        if (logFunction == NULL) {
            return;
        }

        va_list argptr;
        va_start(argptr, CFormatString);
        std::string res;
        int len = vaListToString(CFormatString, argptr, res);
        if (len > 0) {
            (*logFunction)(res);
        }
        va_end(argptr);

    }